

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# norm2allmodes.h
# Opt level: O3

void __thiscall
icu_63::ComposeNormalizer2::normalizeUTF8
          (ComposeNormalizer2 *this,uint32_t options,StringPiece src,ByteSink *sink,Edits *edits,
          UErrorCode *errorCode)

{
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  if ((options >> 0xd & 1) == 0 && edits != (Edits *)0x0) {
    Edits::reset(edits);
  }
  Normalizer2Impl::composeUTF8
            ((this->super_Normalizer2WithImpl).impl,options,this->onlyContiguous,(uint8_t *)src.ptr_
             ,(uint8_t *)(src.ptr_ + src.length_),sink,edits,errorCode);
  (*sink->_vptr_ByteSink[4])(sink);
  return;
}

Assistant:

void
    normalizeUTF8(uint32_t options, StringPiece src, ByteSink &sink,
                  Edits *edits, UErrorCode &errorCode) const U_OVERRIDE {
        if (U_FAILURE(errorCode)) {
            return;
        }
        if (edits != nullptr && (options & U_EDITS_NO_RESET) == 0) {
            edits->reset();
        }
        const uint8_t *s = reinterpret_cast<const uint8_t *>(src.data());
        impl.composeUTF8(options, onlyContiguous, s, s + src.length(),
                         &sink, edits, errorCode);
        sink.Flush();
    }